

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

void __thiscall amrex::MFIter::operator++(MFIter *this)

{
  this->currentIndex = this->currentIndex + 1;
  return;
}

Assistant:

void
MFIter::operator++ () noexcept
{
#ifdef AMREX_USE_OMP
    if (dynamic)
    {
#pragma omp atomic capture
        currentIndex = nextDynamicIndex++;
    }
    else
#endif
    {
        ++currentIndex;

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            Gpu::Device::setStreamIndex((streams > 0) ? currentIndex%streams : -1);
            AMREX_GPU_ERROR_CHECK();
#ifdef AMREX_DEBUG
//            Gpu::synchronize();
#endif
        }
#endif
    }
}